

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *this;
  ExpressionKind EVar1;
  uint uVar2;
  size_type sVar3;
  Expression *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  SyntaxNode *pSVar7;
  Scope *pSVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpressionSyntax *pEVar9;
  Expression *this_01;
  UnaryExpression *pUVar10;
  ForLoopStatement *loop;
  StatementSyntax *pSVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  specific_symbol_iterator<slang::ast::VariableSymbol> extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  size_type extraout_RDX_00;
  byte bVar13;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> iVar14;
  Expression *stopExpr;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_Statements_h:168:37)>
  guard;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_370;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  SourceRange local_2a0;
  specific_symbol_iterator<slang::ast::VariableSymbol> __begin3;
  not_null<const_slang::ast::Scope_*> local_288;
  EvalContext local_250;
  undefined4 extraout_var_01;
  specific_symbol_iterator<slang::ast::VariableSymbol> sVar12;
  
  initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.data_ =
       (pointer)loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.firstElement;
  loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.len = 0;
  loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.cap = 5;
  this = &syntax->initializers;
  pSVar8 = (Scope *)0x0;
  if ((syntax->initializers).elements.size_ != 0) {
    pSVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[](this,0);
    if (pSVar7->kind == ForVariableDeclaration) {
      pSVar8 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
      iVar14 = Scope::membersOfType<slang::ast::VariableSymbol>(pSVar8);
      sVar12 = iVar14.m_end.current;
      __begin3 = iVar14.m_begin.current;
      while (iVar14.m_begin.current.current != sVar12.current) {
        steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
             (pointer)Symbol::as<slang::ast::VariableSymbol>(iVar14.m_begin.current.current);
        SmallVectorBase<slang::ast::VariableSymbol_const*>::
        emplace_back<slang::ast::VariableSymbol_const*>
                  ((SmallVectorBase<slang::ast::VariableSymbol_const*> *)&loopVars,
                   (VariableSymbol **)&steps);
        Scope::specific_symbol_iterator<slang::ast::VariableSymbol>::operator++(&__begin3);
        iVar14.m_end.current = extraout_RDX.current;
        iVar14.m_begin.current = __begin3.current;
      }
      bVar13 = 0;
      goto LAB_002327e6;
    }
    pSVar8 = (Scope *)((syntax->initializers).elements.size_ + 1 >> 1);
  }
  bVar13 = 0;
  __begin3.current = (Symbol *)this;
  for (local_288.ptr = (Scope *)0x0;
      (__begin3.current != (Symbol *)this || (local_288.ptr != pSVar8));
      local_288.ptr = (Scope *)((long)&(local_288.ptr)->compilation + 1)) {
    pSVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::
             iterator_base<const_slang::syntax::SyntaxNode_*>::operator*
                       ((iterator_base<const_slang::syntax::SyntaxNode_*> *)&__begin3);
    pEVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar7);
    iVar5 = Expression::bind((int)pEVar9,(sockaddr *)context,0x20);
    steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
         (pointer)CONCAT44(extraout_var,iVar5);
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&initializers,(Expression **)&steps
              );
    bVar4 = Expression::bad((Expression *)CONCAT44(extraout_var,iVar5));
    bVar13 = bVar13 | bVar4;
  }
LAB_002327e6:
  stopExpr = (Expression *)0x0;
  if (syntax->stopExpr != (ExpressionSyntax *)0x0) {
    iVar5 = Expression::bind((int)syntax->stopExpr,(sockaddr *)context,0);
    stopExpr = (Expression *)CONCAT44(extraout_var_00,iVar5);
  }
  this_00 = stopExpr;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)steps.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  local_288.ptr = (Scope *)0x0;
  sVar3 = (syntax->steps).elements.size_;
  __begin3.current = (Symbol *)&syntax->steps;
  do {
    if ((__begin3.current == (Symbol *)&syntax->steps) &&
       (local_288.ptr == (Scope *)(sVar3 + 1 >> 1))) {
      if ((bVar13 != 0) ||
         ((this_00 != (Expression *)0x0 && (bVar4 = Expression::bad(this_00), bVar4)))) {
        loop = (ForLoopStatement *)Statement::badStmt(compilation,(Statement *)0x0);
      }
      else {
        uVar2 = (stmtCtx->flags).m_bits;
        guard.valid = true;
        (stmtCtx->flags).m_bits = uVar2 | 9;
        guard.func.this = stmtCtx;
        guard.func.savedFlags.m_bits = uVar2;
        pSVar11 = not_null<slang::syntax::StatementSyntax_*>::get(&syntax->statement);
        iVar5 = Statement::bind((int)pSVar11,(sockaddr *)context,(socklen_t)stmtCtx);
        iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (&initializers.super_SmallVectorBase<const_slang::ast::Expression_*>,
                           (EVP_PKEY_CTX *)compilation,src);
        __begin3.current = (Symbol *)CONCAT44(extraout_var_03,iVar6);
        iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (&steps.super_SmallVectorBase<const_slang::ast::Expression_*>,
                           (EVP_PKEY_CTX *)compilation,src_00);
        local_370.data_ = (pointer)CONCAT44(extraout_var_04,iVar6);
        local_2a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        loop = BumpAllocator::
               emplace<slang::ast::ForLoopStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,
                          (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&__begin3,
                          &stopExpr,&local_370,(Statement *)CONCAT44(extraout_var_02,iVar5),
                          &local_2a0);
        iVar6 = SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                          (&loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>,
                           (EVP_PKEY_CTX *)compilation,src_01);
        (loop->loopVars).data_ = (pointer)CONCAT44(extraout_var_05,iVar6);
        (loop->loopVars).size_ = extraout_RDX_00;
        if (((Statement *)CONCAT44(extraout_var_02,iVar5))->kind == Invalid) {
          loop = (ForLoopStatement *)Statement::badStmt(compilation,&loop->super_Statement);
        }
        else if (((uVar2 & 8) == 0) && ((compilation->options).strictDriverChecking == false)) {
          UnrollVisitor::UnrollVisitor((UnrollVisitor *)&__begin3,context);
          UnrollVisitor::handle((UnrollVisitor *)&__begin3,loop);
          EvalContext::~EvalContext(&local_250);
        }
        ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Statements.h:168:37)>
        ::~ScopeGuard(&guard);
      }
      SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
                (&steps.super_SmallVectorBase<const_slang::ast::Expression_*>);
      SmallVectorBase<const_slang::ast::VariableSymbol_*>::~SmallVectorBase
                (&loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>);
      SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
                (&initializers.super_SmallVectorBase<const_slang::ast::Expression_*>);
      return &loop->super_Statement;
    }
    pEVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<const_slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&__begin3);
    iVar5 = Expression::bind((int)pEVar9,(sockaddr *)context,0x20);
    this_01 = (Expression *)CONCAT44(extraout_var_01,iVar5);
    guard.func.this = (StatementContext *)this_01;
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&steps,(Expression **)&guard);
    bVar4 = Expression::bad(this_01);
    bVar13 = bVar13 | bVar4;
    EVar1 = this_01->kind;
    if (EVar1 != Invalid) {
      if (EVar1 == UnaryOp) {
        pUVar10 = Expression::as<slang::ast::UnaryExpression>(this_01);
        if (3 < pUVar10->op - Preincrement) goto LAB_002328d9;
      }
      else if ((EVar1 != Assignment) && (EVar1 != Call)) {
LAB_002328d9:
        bVar13 = 1;
        ASTContext::addDiag(context,(DiagCode)0x1f0008,this_01->sourceRange);
      }
    }
    local_288.ptr = (Scope *)((long)&(local_288.ptr)->compilation + 1);
  } while( true );
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.getOptions().strictDriverChecking) {
        UnrollVisitor visitor(context);
        visitor.visit(*result);
    }

    return *result;
}